

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_logger.c
# Opt level: O0

void default_logfn(pcp_loglvl_e mode,char *msg)

{
  ulong local_38;
  uint64_t diff;
  timeval cur_timestamp;
  char *prefix;
  char *msg_local;
  pcp_loglvl_e mode_local;
  
  gettimeofday((timeval *)&diff,(__timezone_ptr_t)0x0);
  if ((default_logfn::prev_timestamp.tv_sec == 0) && (default_logfn::prev_timestamp.tv_usec == 0)) {
    default_logfn::prev_timestamp.tv_sec = diff;
    default_logfn::prev_timestamp.tv_usec = cur_timestamp.tv_sec;
    local_38 = 0;
  }
  else {
    local_38 = (diff - default_logfn::prev_timestamp.tv_sec) * 1000000 +
               (cur_timestamp.tv_sec - default_logfn::prev_timestamp.tv_usec);
  }
  switch(mode) {
  case PCP_LOGLVL_ERR:
  case PCP_LOGLVL_PERR:
    cur_timestamp.tv_usec = (__suseconds_t)anon_var_dwarf_481c;
    break;
  case PCP_LOGLVL_WARN:
    cur_timestamp.tv_usec = (__suseconds_t)anon_var_dwarf_4832;
    break;
  case PCP_LOGLVL_INFO:
    cur_timestamp.tv_usec = (__suseconds_t)anon_var_dwarf_4848;
    break;
  case PCP_LOGLVL_DEBUG:
    cur_timestamp.tv_usec = (__suseconds_t)anon_var_dwarf_485e;
    break;
  default:
    cur_timestamp.tv_usec = (__suseconds_t)anon_var_dwarf_4868;
  }
  fprintf(_stderr,"%3llus %03llums %03lluus %-7s: %s\n",(long)local_38 / 1000000,
          (local_38 % 1000000) / 1000,(long)local_38 % 1000,cur_timestamp.tv_usec,msg);
  return;
}

Assistant:

static void default_logfn(pcp_loglvl_e mode, const char *msg) {

    const char *prefix;
    static struct timeval prev_timestamp = {0, 0};
    struct timeval cur_timestamp;
    uint64_t diff;

    gettimeofday(&cur_timestamp, NULL);

    if ((prev_timestamp.tv_sec == 0) && (prev_timestamp.tv_usec == 0)) {
        prev_timestamp = cur_timestamp;
        diff = 0;
    } else {
        diff = (cur_timestamp.tv_sec - prev_timestamp.tv_sec) * 1000000 +
               (cur_timestamp.tv_usec - prev_timestamp.tv_usec);
    }

    switch (mode) {
    case PCP_LOGLVL_ERR:
    case PCP_LOGLVL_PERR:
        prefix = "ERROR";
        break;
    case PCP_LOGLVL_WARN:
        prefix = "WARNING";
        break;
    case PCP_LOGLVL_INFO:
        prefix = "INFO";
        break;
    case PCP_LOGLVL_DEBUG:
        prefix = "DEBUG";
        break;
    default:
        prefix = "UNKNOWN";
        break;
    }

    fprintf(stderr, "%3llus %03llums %03lluus %-7s: %s\n",
            (long long int)diff / 1000000,
            (long long int)(diff % 1000000) / 1000, (long long int)diff % 1000,
            prefix, msg);
}